

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O2

int_fast32_t detzcode(char *codep)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = (byte)*codep & 0x7f;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    uVar3 = uVar3 << 8 | (uint)(byte)codep[lVar2];
  }
  uVar1 = uVar3 | 0x80000000;
  if (-1 < *codep) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

static int_fast32_t detzcode( const char * codep )
{
    int_fast32_t result;
    int          i;
    int_fast32_t one = 1;
    int_fast32_t halfmaxval = one << ( 32 - 2 );
    int_fast32_t maxval = halfmaxval - 1 + halfmaxval;
    int_fast32_t minval = -1 - maxval;

    result = codep[ 0 ] & 0x7f;

    for ( i = 1; i < 4; ++i )
    {
        result = ( result << 8 ) | ( codep[ i ] & 0xff );
    }

    if ( codep[ 0 ] & 0x80 )
    {
        /* Do two's-complement negation even on non-two's-complement machines.
           If the result would be minval - 1, return minval.
        */
        result -= ! _PDCLIB_TWOS_COMPLEMENT && result != 0;
        result += minval;
    }

    return result;
}